

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflowsol.cpp
# Opt level: O2

bool __thiscall
ArcflowSol::is_valid
          (ArcflowSol *this,
          vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
          *sol,int btype)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  pointer ppVar4;
  pointer pIVar5;
  int iVar6;
  ulong uVar7;
  pointer ppVar8;
  ulong uVar9;
  int i;
  long lVar10;
  pair<int,_int> *itpair;
  pointer ppVar11;
  vector<int,_std::allocator<int>_> w;
  allocator_type local_59;
  pointer local_58;
  long local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  ppVar8 = (sol->
           super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (sol->
             super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_50 = (long)btype * 0x18;
  while( true ) {
    if (ppVar8 == local_58) break;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_48,(long)(this->inst).ndims,&local_59);
    ppVar4 = (ppVar8->second).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (ppVar11 = (ppVar8->second).
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar4;
        ppVar11 = ppVar11 + 1) {
      if (((this->inst).binary == true) && (1 < ppVar11->second)) goto LAB_0010f2d1;
      iVar2 = ppVar11->first;
      pIVar5 = (this->inst).items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar10 = 0; lVar10 < (this->inst).ndims; lVar10 = lVar10 + 1) {
        iVar6 = Item::operator[](pIVar5 + iVar2,(int)lVar10);
        local_48._M_impl.super__Vector_impl_data._M_start[lVar10] =
             local_48._M_impl.super__Vector_impl_data._M_start[lVar10] + iVar6 * ppVar11->second;
      }
    }
    uVar3 = (this->inst).ndims;
    uVar7 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar7 = 0;
    }
    uVar9 = 0;
    while (uVar7 != uVar9) {
      piVar1 = local_48._M_impl.super__Vector_impl_data._M_start + uVar9;
      lVar10 = uVar9 * 4;
      uVar9 = uVar9 + 1;
      if (*(int *)(*(long *)((long)&(((this->inst).Ws.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data + local_50) + lVar10) < *piVar1)
      goto LAB_0010f2d1;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
    ppVar8 = ppVar8 + 1;
  }
LAB_0010f2e0:
  return ppVar8 == local_58;
LAB_0010f2d1:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  goto LAB_0010f2e0;
}

Assistant:

bool ArcflowSol::is_valid(const std::vector<pattern_pair> &sol, int btype) const {
	for (const pattern_pair &pat : sol) {
		std::vector<int> w(inst.ndims);
		for (const auto &itpair : pat.second) {
			if (inst.binary && itpair.second > 1) {
				return false;
			}
			const Item &it = inst.items[itpair.first];
			for (int i = 0; i < inst.ndims; i++) {
				w[i] += it[i] * itpair.second;
			}
		}
		for (int i = 0; i < inst.ndims; i++) {
			if (w[i] > inst.Ws[btype][i]) {
				return false;
			}
		}
	}
	return true;
}